

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanBGPlanner.cpp
# Opt level: O1

VectorSet * __thiscall
MonahanBGPlanner::ComputeGaoa
          (MonahanBGPlanner *this,GaoVectorSet *Gao,ValueFunctionPOMDPDiscrete *V,Index a,Index o,
          Index aPrime)

{
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  undefined1 auVar3 [16];
  pointer pAVar4;
  size_t sVar5;
  PlanningUnitDecPOMDPDiscrete *pPVar6;
  undefined8 uVar7;
  VectorSet *pVVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_XMM2 [16];
  vector<double,_std::allocator<double>_> v1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  v;
  allocator_type local_79;
  ValueFunctionPOMDPDiscrete *local_78;
  vector<double,_std::allocator<double>_> local_70;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_58;
  ulong local_40;
  double local_38;
  
  local_58.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar6 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
  if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar6 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
  }
  pmVar1 = (Gao->
           super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
           ).
           super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
           .base_[(Gao->
                  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                  ).
                  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                  .origin_offset_ +
                  (ulong)a *
                  (Gao->
                  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                  ).
                  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                  .stride_list_.elems[0] +
                  (ulong)o *
                  (Gao->
                  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                  ).
                  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                  .stride_list_.elems[1]];
  pDVar2 = pPVar6->_m_DecPOMDP;
  local_78 = V;
  local_40 = (**(code **)(*(long *)((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb0)) +
                         0x70))((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb0));
  pAVar4 = (local_78->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((local_78->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
      super__Vector_impl_data._M_finish != pAVar4) {
    uVar9 = 0;
    do {
      if (pAVar4[uVar9]._m_action == aPrime) {
        pPVar6 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
        if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar6 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
        }
        sVar5 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar6->super_PlanningUnitMADPDiscrete);
        std::vector<double,_std::allocator<double>_>::vector(&local_70,sVar5,&local_79);
        uVar10 = 0;
        while( true ) {
          pPVar6 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
          if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
            pPVar6 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
          }
          sVar5 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar6->super_PlanningUnitMADPDiscrete);
          uVar11 = (ulong)uVar10;
          if (sVar5 == uVar11) break;
          pPVar6 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
          if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
            pPVar6 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
          }
          local_38 = (double)(**(code **)(*(long *)pPVar6->_m_DecPOMDP + 0xc0))
                                       (pPVar6->_m_DecPOMDP,uVar11,a);
          pPVar6 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
          if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
            pPVar6 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
          }
          uVar7 = (**(code **)((long)*(pPVar6->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
          if ((ulong)((long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) <= uVar11) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar11);
          }
          auVar3 = vcvtusi2sd_avx512f(in_XMM2,uVar7);
          auVar12._0_8_ = local_38 / auVar3._0_8_;
          auVar12._8_8_ = 0;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_40;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (pmVar1->data_).data_[pmVar1->size2_ * uVar9 + uVar11];
          auVar3 = vfmadd231sd_fma(auVar12,auVar13,auVar3);
          local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] = auVar3._0_8_;
          uVar10 = uVar10 + 1;
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&local_58,&local_70);
        if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
      }
      uVar9 = (ulong)((int)uVar9 + 1);
      pAVar4 = (local_78->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (((long)(local_78->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pAVar4 >> 3) *
             -0x3333333333333333 - uVar9 != 0);
  }
  pVVar8 = AlphaVectorPlanning::VectorOfVectorsToVectorSet(&local_58);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_58);
  return pVVar8;
}

Assistant:

VectorSet* MonahanBGPlanner::ComputeGaoa(const GaoVectorSet &Gao,
                                         const ValueFunctionPOMDPDiscrete &V,
                                         Index a,
                                         Index o,
                                         Index aPrime) const
{
    vector<vector<double> > v;
    //for the current a,o, beta, we are now going to construct a set of vectors...
    //  Note: the tech-report specifies the value for a (joint) belief. Therefore
    //  it is possible to select the maximizing back-projected vector (g_ao^v') in
    //  (3.22).
    //
    //  In contrast, here we are generating the the vectors over the complete 
    //  joint belief space. As such, we can not generate the vector 
    //  v*_{b,a,\beta} as done in (3.22). Instead we generate the set of possible
    //      v_{a,\beta}^k   = R_a + \sum_{o} g_{ao}^v'[k] 
    //                      = \sum_{o} [  (R_a / |o|) +  g_{ao}^v'[k]  ]      (A)
    //                                    ==========================
    //                                           
    //  
    //  (   Note that, because each \beta will specify at least one different joint action
    //      (for one joint observation), the set of v_{a,\beta}^k vectors generated for 
    //      different \beta are in fact different.                                            ) 
    //
    //!!HOWEVER!! these vectors that are called 'v1' below corresponds to the  
    //  part of (A) in brackets. It just adds (an 1/|o| fraction of) the immediate
    //  reward to  g_{ao}^v[k], which is just some back projected vector. Let us call 
    //  this new function 'rg'. I.e.:
    //
    //      rg_ao^k = (R_a / |o|) +  g_{ao}^v'[k]
    //
    //  while it is the case that each \beta will only be consistent with a subset of these
    //  vectors, it is *NOT* the case that each \beta specifies completely different sets of
    //  rg vectors!!!
    //
    //  As such, it does not make sense to have G[a][o][betaI] store sets of rg_ao^k,
    //  many of which contain duplicates!
    //
    //  INSTEAD I propose the following:
    //      1) store G[a][o][a'], the set of rg_ao^k such that v'[k] specifies a'
    //      2) then in 'cross-sum' only loop over the a' consistent with the jpol
    //

    //a pointer used to point to different vectors in Gao
    VectorSet *vGao=Gao[a][o];
    double gamma=GetPU()->GetDiscount();

    for(Index k=0;k!=V.size();k++) //for each vector v[k] in V^t+1
    {
        //if the vector V[k] specifies the joint action that is consistent with \beta (see (3.15))
        if(V[k].GetAction()==aPrime)
        {
            vector<double> v1(GetPU()->GetNrStates());
            for(Index s=0;s!=GetPU()->GetNrStates();s++)
            {
                //the immediate reward is divided equally over the vectors:   
                double R_s_a_o = (GetPU()->GetReward(s,a)) / GetPU()->GetNrJointObservations();
                
                //the following is just one of the vectors g_ao^v[k] (g_{ao}^{v^{t+1}_a'}) from (3.15)
                double g_a_o_vk_s =  (*vGao)(k,s);
                v1.at(s) =  R_s_a_o + gamma * g_a_o_vk_s;
            }
            v.push_back(v1);
        }
    }
    return(VectorOfVectorsToVectorSet(v));
}